

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O2

bool __thiscall
S2MinDistanceCellTarget::UpdateMinDistance
          (S2MinDistanceCellTarget *this,S2Cell *cell,S2MinDistance *min_dist)

{
  double dVar1;
  S1ChordAngle SVar2;
  
  SVar2 = S2Cell::GetDistance(&this->cell_,cell);
  dVar1 = (min_dist->super_S1ChordAngle).length2_;
  if (SVar2.length2_ < dVar1) {
    (min_dist->super_S1ChordAngle).length2_ = SVar2.length2_;
  }
  return SVar2.length2_ < dVar1;
}

Assistant:

bool S2MinDistanceCellTarget::UpdateMinDistance(
    const S2Cell& cell, S2MinDistance* min_dist) {
  return min_dist->UpdateMin(S2MinDistance(cell_.GetDistance(cell)));
}